

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_handler(nng_http *conn,void *arg,nng_aio *aio)

{
  size_t sVar1;
  nni_ws *pnVar2;
  _Bool _Var3;
  int iVar4;
  nng_err nVar5;
  nng_http_status nVar6;
  char *pcVar7;
  void *item;
  size_t sStack_78;
  char key [29];
  nni_ws *local_50;
  nni_ws *ws;
  char *local_40;
  nni_ws *local_38;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  nVar6 = NNG_HTTP_STATUS_SERVICE_UNAVAILABLE;
  if (*(char *)((long)arg + 0x111) == '\0') {
    pcVar7 = nng_http_get_version(conn);
    iVar4 = strcmp(pcVar7,"HTTP/1.1");
    nVar6 = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
    if (iVar4 != 0) goto LAB_0012d477;
    pcVar7 = nng_http_get_method(conn);
    iVar4 = strcmp(pcVar7,"GET");
    if (iVar4 != 0) {
LAB_0012d472:
      nVar6 = NNG_HTTP_STATUS_BAD_REQUEST;
      goto LAB_0012d477;
    }
    pcVar7 = nng_http_get_header(conn,"Content-Length");
    if (pcVar7 != (char *)0x0) {
      iVar4 = atoi(pcVar7);
      nVar6 = NNG_HTTP_STATUS_CONTENT_TOO_LARGE;
      if (0 < iVar4) goto LAB_0012d477;
    }
    pcVar7 = nng_http_get_header(conn,"Transfer-Encoding");
    if (pcVar7 != (char *)0x0) {
      pcVar7 = nni_strcasestr(pcVar7,"chunked");
      nVar6 = NNG_HTTP_STATUS_CONTENT_TOO_LARGE;
      if (pcVar7 != (char *)0x0) goto LAB_0012d477;
    }
    pcVar7 = nng_http_get_header(conn,"Upgrade");
    if ((((((pcVar7 == (char *)0x0) || (_Var3 = ws_contains_word(pcVar7,"websocket"), !_Var3)) ||
          (pcVar7 = nng_http_get_header(conn,"Connection"), pcVar7 == (char *)0x0)) ||
         ((_Var3 = ws_contains_word(pcVar7,"upgrade"), !_Var3 ||
          (pcVar7 = nng_http_get_header(conn,"Sec-WebSocket-Version"), pcVar7 == (char *)0x0)))) ||
        ((*pcVar7 != '1' || ((pcVar7[1] != '3' || (pcVar7[2] != '\0')))))) ||
       ((pcVar7 = nng_http_get_header(conn,"Sec-WebSocket-Key"), pcVar7 == (char *)0x0 ||
        (iVar4 = ws_make_accept(pcVar7,(char *)&sStack_78), iVar4 != 0)))) goto LAB_0012d472;
    local_40 = nng_http_get_header(conn,"Sec-WebSocket-Protocol");
    pcVar7 = *(char **)((long)arg + 0x58);
    if (local_40 != (char *)0x0) {
      if (pcVar7 == (char *)0x0) goto LAB_0012d472;
      _Var3 = ws_contains_word(pcVar7,local_40);
      nVar6 = NNG_HTTP_STATUS_BAD_REQUEST;
      if (_Var3) goto LAB_0012d5f7;
      goto LAB_0012d477;
    }
    nVar6 = NNG_HTTP_STATUS_BAD_REQUEST;
    if (pcVar7 != (char *)0x0) goto LAB_0012d477;
LAB_0012d5f7:
    nng_http_set_status(conn,NNG_HTTP_STATUS_SWITCHING,(char *)0x0);
    local_38 = (nni_ws *)((long)arg + 0x130);
    for (item = nni_list_first((nni_list *)local_38); item != (void *)0x0;
        item = nni_list_next((nni_list *)local_38,item)) {
      nVar5 = nng_http_set_header(conn,*(char **)((long)item + 0x10),*(char **)((long)item + 0x18));
      if (nVar5 != NNG_OK) {
        nVar6 = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
        goto LAB_0012d477;
      }
    }
    if (*(code **)((long)arg + 0x120) == (code *)0x0) {
LAB_0012d676:
      iVar4 = ws_init(&local_50);
      nVar6 = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
      if (iVar4 != 0) goto LAB_0012d477;
      local_50->http = conn;
      local_50->server = true;
      sVar1 = *(size_t *)((long)arg + 0x150);
      local_50->maxframe = *(size_t *)((long)arg + 0x148);
      local_50->fragsize = sVar1;
      local_50->recvmax = *(size_t *)((long)arg + 0x158);
      local_50->isstream = *(_Bool *)((long)arg + 0x112);
      local_50->recv_text = *(_Bool *)((long)arg + 0x114);
      local_50->send_text = *(_Bool *)((long)arg + 0x113);
      local_50->listener = (nni_ws_listener *)arg;
      ws = (nni_ws *)local_50->keybuf;
      *(size_t *)local_50->keybuf = sStack_78;
      *(ulong *)(local_50->keybuf + 8) = CONCAT35(key._5_3_,key._0_5_);
      *(ulong *)(local_50->keybuf + 0xd) = CONCAT53(key._8_5_,key._5_3_);
      *(undefined8 *)(local_50->keybuf + 0x15) = key._13_8_;
      nni_http_set_static_header(conn,&(local_50->hdrs).connection,"Connection","Upgrade");
      nni_http_set_static_header(conn,&(local_50->hdrs).upgrade,"Upgrade","websocket");
      local_38 = local_50;
      nni_http_set_static_header(conn,&(local_50->hdrs).wsaccept,"Sec-WebSocket-Accept",(char *)ws);
      if (local_40 != (char *)0x0) {
        nni_http_set_static_header(conn,&(local_38->hdrs).wsproto,"Sec-WebSocket-Protocol",local_40)
        ;
      }
      pnVar2 = local_38;
      nni_list_append((nni_list *)((long)arg + 0xd8),local_38);
      nng_http_write_response(conn,&pnVar2->httpaio);
      nni_http_hijack(conn);
      nni_aio_set_output(aio,0,(void *)0x0);
      goto LAB_0012d7c3;
    }
    nVar5 = (**(code **)((long)arg + 0x120))(*(undefined8 *)((long)arg + 0x128));
    if (nVar5 == NNG_OK) {
      nVar6 = nng_http_get_status(conn);
      if (nVar6 == NNG_HTTP_STATUS_SWITCHING) goto LAB_0012d676;
      goto LAB_0012d7c3;
    }
  }
  else {
LAB_0012d477:
    nVar5 = nni_http_set_error(conn,nVar6,(char *)0x0,(char *)0x0);
    if (nVar5 == NNG_OK) {
LAB_0012d7c3:
      nni_aio_finish(aio,NNG_OK,0);
      goto LAB_0012d7cf;
    }
  }
  nni_aio_finish_error(aio,nVar5);
LAB_0012d7cf:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_handler(nng_http *conn, void *arg, nng_aio *aio)
{
	nni_ws_listener *l = arg;
	nni_ws          *ws;
	const char      *ptr;
	const char      *proto;
	uint16_t         status;
	int              rv;
	char             key[29];
	ws_header       *hdr;

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		status = NNG_HTTP_STATUS_SERVICE_UNAVAILABLE;
		goto err;
	}

	// Now check the headers, etc.
	if (strcmp(nng_http_get_version(conn), "HTTP/1.1") != 0) {
		status = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
		goto err;
	}

	if (strcmp(nng_http_get_method(conn), "GET") != 0) {
		// HEAD request.  We can't really deal with it.
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	if ((((ptr = nng_http_get_header(conn, "Content-Length")) != NULL) &&
	        (atoi(ptr) > 0)) ||
	    (((ptr = nng_http_get_header(conn, "Transfer-Encoding")) !=
	         NULL) &&
	        (nni_strcasestr(ptr, "chunked") != NULL))) {
		status = NNG_HTTP_STATUS_CONTENT_TOO_LARGE;
		goto err;
	}

	// These headers have to be present.
	if (((ptr = nng_http_get_header(conn, "Upgrade")) == NULL) ||
	    (!ws_contains_word(ptr, "websocket")) ||
	    ((ptr = nng_http_get_header(conn, "Connection")) == NULL) ||
	    (!ws_contains_word(ptr, "upgrade")) ||
	    ((ptr = nng_http_get_header(conn, "Sec-WebSocket-Version")) ==
	        NULL) ||
	    (strcmp(ptr, "13") != 0)) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	if (((ptr = nng_http_get_header(conn, "Sec-WebSocket-Key")) == NULL) ||
	    (ws_make_accept(ptr, key) != 0)) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	// If the client has requested a specific subprotocol, then
	// we need to try to match it to what the handler says we
	// support. (If no suitable option is found in the handler, we
	// fail the request.)
	proto = nng_http_get_header(conn, "Sec-WebSocket-Protocol");
	if (proto == NULL) {
		if (l->proto != NULL) {
			status = NNG_HTTP_STATUS_BAD_REQUEST;
			goto err;
		}
	} else if ((l->proto == NULL) ||
	    (!ws_contains_word(l->proto, proto))) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_SWITCHING, NULL);

	// Set any user supplied headers.  This is better than using a hook
	// for most things, because it is loads easier.  Note that websocket
	// headers we care about will be overridden below!
	NNI_LIST_FOREACH (&l->headers, hdr) {
		if (nng_http_set_header(conn, hdr->name, hdr->value) != 0) {
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			goto err;
		}
	}

	// The hook function gives us the ability to intercept the HTTP
	// response altogether.  Its best not to do this unless you really
	// need to, because it's much more complex.  But if you want to set
	// up an HTTP Authorization handler this might be the only choice.
	if (l->hookfn != NULL) {
		rv = l->hookfn(l->hookarg, conn);
		if (rv != 0) {
			nni_aio_finish_error(aio, rv);
			nni_mtx_unlock(&l->mtx);
			return;
		}

		if (nng_http_get_status(conn) != NNG_HTTP_STATUS_SWITCHING) {
			// The hook has decided to give back a
			// different reply and we are not upgrading
			// anymore.  For example the Origin might not
			// be permitted, or another level of
			// authentication may be required.
			nni_aio_finish(aio, 0, 0);
			nni_mtx_unlock(&l->mtx);
			return;
		}
	}

	// We are good to go, provided we can get the websocket struct,
	// and send the reply.
	if ((rv = ws_init(&ws)) != 0) {
		status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
		goto err;
	}
	ws->http      = conn;
	ws->server    = true;
	ws->maxframe  = l->maxframe;
	ws->fragsize  = l->fragsize;
	ws->recvmax   = l->recvmax;
	ws->isstream  = l->isstream;
	ws->recv_text = l->recv_text;
	ws->send_text = l->send_text;
	ws->listener  = l;
	memcpy(ws->keybuf, key, sizeof(ws->keybuf));

	nni_http_set_static_header(
	    conn, &ws->hdrs.connection, "Connection", "Upgrade");
	nni_http_set_static_header(
	    conn, &ws->hdrs.upgrade, "Upgrade", "websocket");
	nni_http_set_static_header(
	    conn, &ws->hdrs.wsaccept, "Sec-WebSocket-Accept", ws->keybuf);
	if (proto != NULL) {
		// NB: we still have the request protocol in the header, so
		// that should be fine.
		nni_http_set_static_header(
		    conn, &ws->hdrs.wsproto, "Sec-WebSocket-Protocol", proto);
	}

	nni_list_append(&l->reply, ws);
	nng_http_write_response(conn, &ws->httpaio);
	(void) nni_http_hijack(conn);
	nni_aio_set_output(aio, 0, NULL);
	nni_aio_finish(aio, 0, 0);
	nni_mtx_unlock(&l->mtx);
	return;

err:
	if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
		nni_aio_finish_error(aio, rv);
	} else {
		nni_aio_finish(aio, 0, 0);
	}
	nni_mtx_unlock(&l->mtx);
}